

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnection.cpp
# Opt level: O0

bool __thiscall
QHttpNetworkConnectionPrivate::shouldEmitChannelError
          (QHttpNetworkConnectionPrivate *this,QIODevice *socket)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  int in_ESI;
  QHttpNetworkConnectionPrivate *in_RDI;
  long in_FS_OFFSET;
  int otherSocket;
  int i;
  bool emitError;
  QHttpNetworkConnection *q;
  QHttpNetworkConnectionChannel *in_stack_00000068;
  char *in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 uVar5;
  byte bVar6;
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  uVar5 = CONCAT13(1,(int3)in_stack_ffffffffffffffbc);
  iVar2 = indexOf((QHttpNetworkConnectionPrivate *)CONCAT44(uVar5,in_stack_ffffffffffffffb8),
                  (QIODevice *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  uVar3 = (uint)(iVar2 == 0);
  uVar4 = QTimer::isActive();
  if ((uVar4 & 1) != 0) {
    QTimer::stop();
    QHttpNetworkConnectionChannel::ensureConnection(in_stack_00000068);
  }
  if (in_RDI->activeChannelCount < in_RDI->channelCount) {
    if ((in_RDI->networkLayerState == HostLookupPending) || (in_RDI->networkLayerState == IPv4or6))
    {
      in_RDI->networkLayerState = Unknown;
    }
    QHttpNetworkConnectionChannel::close((QHttpNetworkConnectionChannel *)in_RDI->channels,in_ESI);
    bVar6 = 1;
  }
  else if ((in_RDI->networkLayerState == HostLookupPending) ||
          (in_RDI->networkLayerState == IPv4or6)) {
    bVar1 = QHttpNetworkConnectionChannel::isSocketBusy
                      ((QHttpNetworkConnectionChannel *)(in_RDI->channels + (int)uVar3));
    if ((bVar1) && (in_RDI->channels[(int)uVar3].state != ClosingState)) {
      QHttpNetworkConnectionChannel::close
                ((QHttpNetworkConnectionChannel *)(in_RDI->channels + iVar2),in_ESI);
      bVar6 = 0;
    }
    else {
      in_RDI->networkLayerState = Unknown;
      QHttpNetworkConnectionChannel::close
                ((QHttpNetworkConnectionChannel *)(in_RDI->channels + iVar2),in_ESI);
      bVar6 = 1;
    }
  }
  else {
    if (((in_RDI->networkLayerState == IPv4) &&
        (in_RDI->channels[iVar2].networkLayerPreference != IPv4Protocol)) ||
       ((in_RDI->networkLayerState == IPv6 &&
        (in_RDI->channels[iVar2].networkLayerPreference != IPv6Protocol)))) {
      QHttpNetworkConnectionChannel::close
                ((QHttpNetworkConnectionChannel *)(in_RDI->channels + iVar2),in_ESI);
      QMetaObject::invokeMethod<>
                ((QObject *)CONCAT44(uVar5,iVar2),(char *)CONCAT44(uVar3,in_stack_ffffffffffffffb0),
                 (ConnectionType)((ulong)in_RDI >> 0x20));
      uVar5 = 0;
    }
    bVar6 = (byte)((uint)uVar5 >> 0x18);
    if (in_RDI->networkLayerState == Unknown) {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)CONCAT44(uVar3,in_stack_ffffffffffffffb0),(char *)in_RDI,
                 in_stack_ffffffffffffffa4,in_stack_ffffffffffffff98);
      QMessageLogger::warning
                (local_28,"We got a connection error when networkLayerState is Unknown");
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(bVar6 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool QHttpNetworkConnectionPrivate::shouldEmitChannelError(QIODevice *socket)
{
    Q_Q(QHttpNetworkConnection);

    bool emitError = true;
    int i = indexOf(socket);
    int otherSocket = (i == 0 ? 1 : 0);

    // If the IPv4 connection still isn't started we need to start it now.
    if (delayedConnectionTimer.isActive()) {
        delayedConnectionTimer.stop();
        channels[otherSocket].ensureConnection();
    }

    if (activeChannelCount < channelCount) {
        if (networkLayerState == HostLookupPending || networkLayerState == IPv4or6)
            networkLayerState = QHttpNetworkConnectionPrivate::Unknown;
        channels[0].close();
        emitError = true;
    } else {
        if (networkLayerState == HostLookupPending || networkLayerState == IPv4or6) {
            if (channels[otherSocket].isSocketBusy() && (channels[otherSocket].state != QHttpNetworkConnectionChannel::ClosingState)) {
                // this was the first socket to fail.
                channels[i].close();
                emitError = false;
            }
            else {
                // Both connection attempts has failed.
                networkLayerState = QHttpNetworkConnectionPrivate::Unknown;
                channels[i].close();
                emitError = true;
            }
        } else {
            if (((networkLayerState == QHttpNetworkConnectionPrivate::IPv4) && (channels[i].networkLayerPreference != QAbstractSocket::IPv4Protocol))
                || ((networkLayerState == QHttpNetworkConnectionPrivate::IPv6) && (channels[i].networkLayerPreference != QAbstractSocket::IPv6Protocol))) {
                // First connection worked so this is the second one to complete and it failed.
                channels[i].close();
                QMetaObject::invokeMethod(q, "_q_startNextRequest", Qt::QueuedConnection);
                emitError = false;
            }
            if (networkLayerState == QHttpNetworkConnectionPrivate::Unknown)
                qWarning("We got a connection error when networkLayerState is Unknown");
        }
    }
    return emitError;
}